

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::PipelineResourceSignatureVkImpl::PipelineResourceSignatureVkImpl
          (PipelineResourceSignatureVkImpl *this,IReferenceCounters *pRefCounters,
          RenderDeviceVkImpl *pDevice,PipelineResourceSignatureDesc *Desc,
          PipelineResourceSignatureInternalDataVk *InternalData)

{
  IMemoryAllocator *RawAllocator;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::PipelineResourceSignatureBase
            (&this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,pRefCounters,
             pDevice,Desc,InternalData);
  (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  .super_ObjectBase<Diligent::IPipelineResourceSignature>.
  super_RefCountedObject<Diligent::IPipelineResourceSignature>.super_IPipelineResourceSignature.
  super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_0091e6f8;
  (this->m_VkDescrSetLayouts)._M_elems[0].m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_VkDescrSetLayouts)._M_elems[0].m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_VkDescrSetLayouts)._M_elems[0].m_VkObject = (VkDescriptorSetLayout_T *)0x0;
  (this->m_VkDescrSetLayouts)._M_elems[1].m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_VkDescrSetLayouts)._M_elems[1].m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_VkDescrSetLayouts)._M_elems[1].m_VkObject = (VkDescriptorSetLayout_T *)0x0;
  *(undefined8 *)(this->m_DescriptorSetSizes)._M_elems = 0xffffffffffffffff;
  this->m_DynamicUniformBufferCount = 0;
  this->m_DynamicStorageBufferCount = 0;
  RawAllocator = GetRawAllocator();
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp:956:13)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp:956:13)>
             ::_M_manager;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<unsigned_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp:960:13)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<unsigned_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp:960:13)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  local_38._M_unused._M_object = this;
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::
  Deserialize<Diligent::PipelineResourceSignatureInternalDataVk>
            (&this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,RawAllocator,
             Desc,InternalData,true,(function<void_()> *)&local_38,
             (function<unsigned_long_()> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

PipelineResourceSignatureVkImpl::PipelineResourceSignatureVkImpl(IReferenceCounters*                            pRefCounters,
                                                                 RenderDeviceVkImpl*                            pDevice,
                                                                 const PipelineResourceSignatureDesc&           Desc,
                                                                 const PipelineResourceSignatureInternalDataVk& InternalData) :
    TPipelineResourceSignatureBase{pRefCounters, pDevice, Desc, InternalData}
{
    try
    {
        Deserialize(
            GetRawAllocator(), Desc, InternalData, /*CreateImmutableSamplers = */ true,
            [this]() //
            {
                CreateSetLayouts(/*IsSerialized*/ true);
            },
            [this]() //
            {
                return ShaderResourceCacheVk::GetRequiredMemorySize(GetNumDescriptorSets(), m_DescriptorSetSizes.data());
            });
    }
    catch (...)
    {
        Destruct();
        throw;
    }
}